

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O1

int archive_write_zip_free(archive_write *a)

{
  void *__ptr;
  undefined8 *__ptr_00;
  
  __ptr = a->format_data;
  while (__ptr_00 = *(undefined8 **)((long)__ptr + 0x90), __ptr_00 != (undefined8 *)0x0) {
    *(undefined8 *)((long)__ptr + 0x90) = *__ptr_00;
    free((void *)__ptr_00[2]);
    free(__ptr_00);
  }
  free(*(void **)((long)__ptr + 0x158));
  archive_entry_free(*(archive_entry **)((long)__ptr + 0x30));
  if (*(char *)((long)__ptr + 0x68) != '\0') {
    aes_ctr_release((archive_crypto_ctx *)((long)__ptr + 100));
  }
  if (*(char *)((long)__ptr + 0x70) != '\0') {
    __hmac_sha1_cleanup((archive_hmac_sha1_ctx *)((long)__ptr + 0x6c));
  }
  free(__ptr);
  a->format_data = (void *)0x0;
  return 0;
}

Assistant:

static int
archive_write_zip_free(struct archive_write *a)
{
	struct zip *zip;
	struct cd_segment *segment;

	zip = a->format_data;
	while (zip->central_directory != NULL) {
		segment = zip->central_directory;
		zip->central_directory = segment->next;
		free(segment->buff);
		free(segment);
	}
	free(zip->buf);
	archive_entry_free(zip->entry);
	if (zip->cctx_valid)
		archive_encrypto_aes_ctr_release(&zip->cctx);
	if (zip->hctx_valid)
		archive_hmac_sha1_cleanup(&zip->hctx);
	/* TODO: Free opt_sconv, sconv_default */

	free(zip);
	a->format_data = NULL;
	return (ARCHIVE_OK);
}